

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O1

string * __thiscall
gmlc::utilities::base64_encode_abi_cxx11_
          (string *__return_storage_ptr__,utilities *this,void *bytes_to_encode,size_t in_len)

{
  byte bVar1;
  undefined6 uVar2;
  byte bVar3;
  ulong in_RAX;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  array<unsigned_char,_3UL> char_array_3;
  array<unsigned_char,_4UL> char_array_4;
  undefined8 local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_38 = in_RAX;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,(ulong)((long)bytes_to_encode * 4) / 3 + 2);
  local_38 = local_38 & 0xffffffffff000000;
  local_38 = (local_38 >> 0x10 & 0xffff) << 0x10;
  uVar8 = 0;
  uVar10 = uVar8;
  if (bytes_to_encode != (void *)0x0) {
    do {
      uVar7 = (int)uVar10 + 1;
      uVar8 = (ulong)uVar7;
      *(utilities *)((long)&local_38 + uVar10) = *this;
      uVar10 = local_38;
      if (uVar7 == 3) {
        bVar1 = (byte)local_38;
        bVar3 = local_38._1_1_;
        bVar4 = (byte)local_38 >> 2;
        local_38._0_5_ = CONCAT14(bVar4,(undefined4)local_38);
        local_38._0_6_ = CONCAT15((bVar1 & 3) << 4 | bVar3 >> 4,(undefined5)local_38);
        uVar2 = (undefined6)local_38;
        local_38._2_1_ = SUB81(uVar10,2);
        bVar1 = local_38._2_1_;
        local_38._0_7_ = CONCAT16((bVar3 & 0xf) << 2 | local_38._2_1_ >> 6,uVar2);
        local_38 = CONCAT17(bVar1,(undefined7)local_38) & 0x3fffffffffffffff;
        lVar9 = 0;
        do {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,
                    "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [*(byte *)((long)&local_38 + lVar9 + 4)]);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        uVar8 = 0;
      }
      bytes_to_encode = (void *)((long)bytes_to_encode + -1);
      this = this + 1;
      uVar10 = uVar8;
    } while (bytes_to_encode != (void *)0x0);
  }
  iVar6 = (int)uVar8;
  if (iVar6 != 0) {
    if (iVar6 < 3) {
      memset((void *)((long)&local_38 + uVar8),0,(ulong)(2 - iVar6) + 1);
    }
    uVar10 = local_38;
    bVar1 = (byte)local_38;
    bVar3 = local_38._1_1_;
    bVar4 = (byte)local_38 >> 2;
    local_38._0_5_ = CONCAT14(bVar4,(undefined4)local_38);
    local_38._0_6_ = CONCAT15((bVar1 & 3) << 4 | bVar3 >> 4,(undefined5)local_38);
    uVar2 = (undefined6)local_38;
    local_38._2_1_ = SUB81(uVar10,2);
    bVar1 = local_38._2_1_;
    local_38._0_7_ = CONCAT16((bVar3 & 0xf) << 2 | local_38._2_1_ >> 6,uVar2);
    local_38 = CONCAT17(bVar1,(undefined7)local_38) & 0x3fffffffffffffff;
    if (-1 < iVar6) {
      uVar10 = 0;
      do {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,
                  "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [*(byte *)((long)&local_38 + uVar10 + 4)]);
        uVar10 = uVar10 + 1;
      } while (iVar6 + 1 != uVar10);
    }
    iVar5 = 3;
    if (3 < iVar6) {
      iVar5 = iVar6;
    }
    iVar6 = (iVar5 - iVar6) + 1;
    while (iVar6 = iVar6 + -1, iVar6 != 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,'=');
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string base64_encode(void const* bytes_to_encode, size_t in_len)
{
    const auto* b2e = static_cast<const unsigned char*>(bytes_to_encode);
    std::string ret;
    ret.reserve((in_len * 4) / 3 + 2);
    int index{0};
    std::array<unsigned char, 3> char_array_3{{0U, 0U, 0U}};
    std::array<unsigned char, 4> char_array_4{{0U, 0U, 0U, 0U}};

    while (in_len-- != 0) {
        char_array_3[index++] = *b2e++;
        if (index == 3) {
            char_array_4[0] = (char_array_3[0] & 0xfcU) >> 2U;
            char_array_4[1] = ((char_array_3[0] & 0x03U) << 4U) +
                ((char_array_3[1] & 0xf0U) >> 4U);
            char_array_4[2] = ((char_array_3[1] & 0x0fU) << 2U) +
                ((char_array_3[2] & 0xc0U) >> 6U);
            char_array_4[3] = char_array_3[2] & 0x3fU;

            for (index = 0; (index < 4); index++) {
                ret.push_back(base64_chars[char_array_4[index]]);
            }
            index = 0;
        }
    }

    if (index != 0) {
        for (int jj = index; jj < 3; ++jj) {
            char_array_3[jj] = '\0';
        }

        char_array_4[0] = (char_array_3[0] & 0xfcU) >> 2U;
        char_array_4[1] = ((char_array_3[0] & 0x03U) << 4U) +
            ((char_array_3[1] & 0xf0U) >> 4U);
        char_array_4[2] = ((char_array_3[1] & 0x0fU) << 2U) +
            ((char_array_3[2] & 0xc0U) >> 6U);
        char_array_4[3] = char_array_3[2] & 0x3fU;

        for (int jj = 0; (jj < index + 1); ++jj) {
            ret.push_back(base64_chars[char_array_4[jj]]);
        }

        while ((index++ < 3)) {
            ret.push_back('=');
        }
    }

    return ret;
}